

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3GenerateConstraintChecks
               (Parse *pParse,Table *pTab,int baseCur,int regRowid,int *aRegIdx,int rowidChng,
               int isUpdate,int overrideError,int ignoreDest,int *pbMayReplace)

{
  short sVar1;
  ushort uVar2;
  int p1;
  sqlite3 *db;
  ExprList *pEVar3;
  char *z;
  byte bVar4;
  int p1_00;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Vdbe *p;
  char *pcVar9;
  Parse *pPVar10;
  Trigger *pTVar11;
  FKey *pFVar12;
  uint uVar13;
  ExprList *pCheck;
  ulong uVar14;
  int nReg;
  long lVar15;
  long lVar16;
  Index *pIdx;
  int local_bc;
  StrAccum local_58;
  
  p1_00 = regRowid;
  if (isUpdate != 0) {
    p1_00 = rowidChng;
  }
  if (rowidChng == 0) {
    p1_00 = regRowid;
  }
  db = pParse->db;
  p = sqlite3GetVdbe(pParse);
  sVar1 = pTab->nCol;
  iVar5 = regRowid + 1;
  if (0 < (long)sVar1) {
    lVar16 = 0x28;
    uVar14 = 0;
    do {
      if (uVar14 != (uint)(int)pTab->iPKey) {
        bVar4 = *(byte *)((long)&pTab->aCol->zName + lVar16);
        if (bVar4 != 0) {
          if (bVar4 == 99) {
            bVar4 = 2;
          }
          uVar13 = (uint)bVar4;
          if (overrideError != 99) {
            uVar13 = overrideError;
          }
          if (uVar13 == 5) {
            uVar13 = (uint)(*(long *)((long)pTab->aCol + lVar16 + -0x20) != 0) * 3 + 2;
          }
          iVar8 = (int)uVar14;
          switch(uVar13) {
          case 2:
            pPVar10 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar10 = pParse;
            }
            pPVar10->mayAbort = '\x01';
          case 1:
          case 3:
            sqlite3VdbeAddOp3(p,5,0x513,uVar13,iVar5 + iVar8);
            pcVar9 = sqlite3MPrintf(db,"%s.%s may not be NULL",pTab->zName,
                                    *(undefined8 *)((long)pTab->aCol + lVar16 + -0x28));
            sqlite3VdbeChangeP4(p,-1,pcVar9,-1);
            break;
          case 4:
            sqlite3VdbeAddOp3(p,0x49,iVar5 + iVar8,ignoreDest,0);
            break;
          default:
            uVar13 = sqlite3VdbeAddOp3(p,0x4a,iVar5 + iVar8,0,0);
            sqlite3ExprCode(pParse,*(Expr **)((long)pTab->aCol + lVar16 + -0x20),iVar5 + iVar8);
            if ((-1 < (int)uVar13) && (uVar13 < (uint)p->nOp)) {
              p->aOp[uVar13].p2 = p->nOp;
            }
          }
        }
      }
      uVar14 = uVar14 + 1;
      lVar16 = lVar16 + 0x30;
    } while ((long)sVar1 != uVar14);
  }
  pEVar3 = pTab->pCheck;
  if (((pEVar3 != (ExprList *)0x0) && ((db->flags & 0x400) == 0)) &&
     (pParse->ckBase = iVar5, 0 < pEVar3->nExpr)) {
    iVar8 = overrideError;
    if (overrideError == 99) {
      iVar8 = 2;
    }
    lVar15 = 0;
    lVar16 = 0;
    do {
      uVar13 = sqlite3VdbeMakeLabel(p);
      sqlite3ExprIfTrue(pParse,*(Expr **)((long)&pEVar3->a->pExpr + lVar15),uVar13,8);
      if (iVar8 == 4) {
        sqlite3VdbeAddOp3(p,1,0,ignoreDest,0);
        iVar8 = 4;
      }
      else {
        if (iVar8 == 5) {
          iVar8 = 2;
        }
        if (*(long *)((long)&pEVar3->a->zName + lVar15) == 0) {
          pcVar9 = (char *)0x0;
        }
        else {
          pcVar9 = sqlite3MPrintf(db,"constraint %s failed");
        }
        sqlite3HaltConstraint(pParse,0x113,iVar8,pcVar9,-1);
      }
      if (p->aLabel != (int *)0x0) {
        p->aLabel[(int)~uVar13] = p->nOp;
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x20;
    } while (lVar16 < pEVar3->nExpr);
  }
  if (rowidChng == 0) {
    local_bc = 0;
    goto LAB_00170657;
  }
  uVar13 = overrideError;
  if (overrideError == 99) {
    bVar4 = 2;
    if (pTab->keyConf != 99) {
      bVar4 = pTab->keyConf;
    }
    uVar13 = (uint)bVar4;
  }
  if (isUpdate == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = sqlite3VdbeAddOp3(p,0x4c,regRowid,0,rowidChng);
  }
  local_bc = 0;
  uVar7 = sqlite3VdbeAddOp3(p,0x36,baseCur,0,regRowid);
  if (uVar13 - 1 < 3) {
LAB_001705e6:
    sqlite3HaltConstraint(pParse,0x613,uVar13,"PRIMARY KEY must be unique",-2);
  }
  else if (uVar13 == 4) {
    local_bc = 0;
    sqlite3VdbeAddOp3(p,1,0,ignoreDest,0);
  }
  else {
    if (uVar13 != 5) {
      uVar13 = 2;
      goto LAB_001705e6;
    }
    if ((db->flags & 0x20000) == 0) {
      pTVar11 = (Trigger *)0x0;
    }
    else {
      pTVar11 = sqlite3TriggersExist(pParse,pTab,0x6a,(ExprList *)0x0,(int *)0x0);
    }
    if ((pTVar11 == (Trigger *)0x0) &&
       (((pParse->db->flags & 0x40000) == 0 ||
        ((pFVar12 = sqlite3FkReferences(pTab), pFVar12 == (FKey *)0x0 &&
         (pTab->pFKey == (FKey *)0x0)))))) {
      local_bc = 1;
      if (pTab->pIndex != (Index *)0x0) {
        pPVar10 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pPVar10 = pParse;
        }
        pPVar10->isMultiWrite = '\x01';
        sqlite3GenerateRowIndexDelete(pParse,pTab,baseCur,(int *)0x0);
      }
    }
    else {
      pPVar10 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar10 = pParse;
      }
      pPVar10->isMultiWrite = '\x01';
      sqlite3GenerateRowDelete(pParse,pTab,baseCur,regRowid,0,pTVar11,5);
      local_bc = 1;
    }
  }
  if ((-1 < (int)uVar7) && (uVar7 < (uint)p->nOp)) {
    p->aOp[uVar7].p2 = p->nOp;
  }
  if ((-1 < (int)uVar6 && isUpdate != 0) && (uVar6 < (uint)p->nOp)) {
    p->aOp[uVar6].p2 = p->nOp;
  }
LAB_00170657:
  pIdx = pTab->pIndex;
  if (pIdx != (Index *)0x0) {
    lVar16 = 0;
    do {
      if (aRegIdx[lVar16] != 0) {
        iVar8 = pIdx->nColumn + 1;
        if ((int)(uint)pIdx->nColumn < pParse->nRangeReg) {
          p1 = pParse->iRangeReg;
          pParse->iRangeReg = iVar8 + p1;
          pParse->nRangeReg = pParse->nRangeReg - iVar8;
        }
        else {
          p1 = pParse->nMem + 1;
          pParse->nMem = iVar8 + pParse->nMem;
        }
        if (pIdx->nColumn == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = 0;
          do {
            iVar8 = pIdx->aiColumn[uVar14] + iVar5;
            if (pIdx->aiColumn[uVar14] == (int)pTab->iPKey) {
              iVar8 = regRowid;
            }
            sqlite3VdbeAddOp3(p,0xf,iVar8,p1 + (int)uVar14,0);
            uVar14 = uVar14 + 1;
          } while (uVar14 < pIdx->nColumn);
        }
        sqlite3VdbeAddOp3(p,0xf,regRowid,(int)uVar14 + p1,0);
        sqlite3VdbeAddOp3(p,0x1f,p1,pIdx->nColumn + 1,aRegIdx[lVar16]);
        pcVar9 = sqlite3IndexAffinityStr(p,pIdx);
        sqlite3VdbeChangeP4(p,-1,pcVar9,0);
        sqlite3ExprCacheRemove(pParse,p1,pIdx->nColumn + 1);
        bVar4 = pIdx->onError;
        if (bVar4 == 0) {
          uVar2 = pIdx->nColumn;
          iVar8 = uVar2 + 1;
          sqlite3ExprCacheRemove(pParse,p1,iVar8);
          if (pParse->nRangeReg <= (int)(uint)uVar2) {
            pParse->nRangeReg = iVar8;
            pParse->iRangeReg = p1;
          }
        }
        else {
          if (bVar4 == 99) {
            bVar4 = 2;
          }
          uVar13 = (uint)bVar4;
          if (overrideError != 99) {
            uVar13 = overrideError;
          }
          uVar6 = uVar13;
          if (((local_bc != 0) && (uVar6 = 5, uVar13 != 4)) && (uVar6 = uVar13, uVar13 == 3)) {
            uVar6 = 2;
          }
          if (pParse->nTempReg == '\0') {
            iVar8 = pParse->nMem + 1;
            pParse->nMem = iVar8;
          }
          else {
            bVar4 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar4;
            iVar8 = pParse->aTempReg[bVar4];
          }
          sqlite3VdbeAddOp3(p,0xf,p1_00,iVar8,0);
          uVar13 = sqlite3VdbeAddOp3(p,0x35,baseCur + 1 + (int)lVar16,0,iVar8);
          sqlite3VdbeChangeP4(p,uVar13,(char *)(long)p1,-0xe);
          uVar2 = pIdx->nColumn;
          nReg = uVar2 + 1;
          sqlite3ExprCacheRemove(pParse,p1,nReg);
          if (pParse->nRangeReg <= (int)(uint)uVar2) {
            pParse->nRangeReg = nReg;
            pParse->iRangeReg = p1;
          }
          if (uVar6 - 1 < 3) {
            local_58.zBase = (char *)0x0;
            local_58.zText = (char *)0x0;
            local_58.nChar = 0;
            local_58.nAlloc = 0;
            local_58.mxAlloc = 200;
            local_58.tooBig = '\0';
            local_58.mallocFailed = '\0';
            local_58.useMalloc = '\x01';
            pcVar9 = " is not unique";
            local_58.db = db;
            if (pIdx->nColumn != 0) {
              pcVar9 = "column ";
              if (1 < pIdx->nColumn) {
                pcVar9 = "columns ";
              }
              uVar14 = 0;
              do {
                z = pTab->aCol[pIdx->aiColumn[uVar14]].zName;
                sqlite3StrAccumAppend(&local_58,pcVar9,-1);
                sqlite3StrAccumAppend(&local_58,z,-1);
                uVar14 = uVar14 + 1;
                pcVar9 = ", ";
              } while (uVar14 < pIdx->nColumn);
              pcVar9 = " is not unique";
              if (1 < pIdx->nColumn) {
                pcVar9 = " are not unique";
              }
            }
            sqlite3StrAccumAppend(&local_58,pcVar9,-1);
            pcVar9 = sqlite3StrAccumFinish(&local_58);
            sqlite3HaltConstraint(pParse,0x813,uVar6,pcVar9,0);
            sqlite3DbFree(local_58.db,pcVar9);
          }
          else if (uVar6 == 4) {
            sqlite3VdbeAddOp3(p,1,0,ignoreDest,0);
          }
          else {
            pPVar10 = pParse->pToplevel;
            if (pParse->pToplevel == (Parse *)0x0) {
              pPVar10 = pParse;
            }
            pPVar10->isMultiWrite = '\x01';
            if ((db->flags & 0x20000) == 0) {
              pTVar11 = (Trigger *)0x0;
            }
            else {
              pTVar11 = sqlite3TriggersExist(pParse,pTab,0x6a,(ExprList *)0x0,(int *)0x0);
            }
            sqlite3GenerateRowDelete(pParse,pTab,baseCur,iVar8,0,pTVar11,5);
            local_bc = 1;
          }
          if ((-1 < (int)uVar13) && (uVar13 < (uint)p->nOp)) {
            p->aOp[uVar13].p2 = p->nOp;
          }
          if (iVar8 != 0) {
            bVar4 = pParse->nTempReg;
            if ((ulong)bVar4 < 8) {
              lVar15 = 0;
              do {
                if (*(int *)((long)&pParse->aColCache[0].iReg + lVar15) == iVar8) {
                  (&pParse->aColCache[0].tempReg)[lVar15] = '\x01';
                  goto LAB_00170ab9;
                }
                lVar15 = lVar15 + 0x18;
              } while ((int)lVar15 != 0xf0);
              pParse->nTempReg = bVar4 + 1;
              pParse->aTempReg[bVar4] = iVar8;
            }
          }
        }
      }
LAB_00170ab9:
      lVar16 = lVar16 + 1;
      pIdx = pIdx->pNext;
    } while (pIdx != (Index *)0x0);
  }
  if (pbMayReplace != (int *)0x0) {
    *pbMayReplace = local_bc;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateConstraintChecks(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int baseCur,        /* Index of a read/write cursor pointing at pTab */
  int regRowid,       /* Index of the range of input registers */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int rowidChng,      /* True if the rowid might collide with existing entry */
  int isUpdate,       /* True for UPDATE, False for INSERT */
  int overrideError,  /* Override onError to this if not OE_Default */
  int ignoreDest,     /* Jump to this label on an OE_Ignore resolution */
  int *pbMayReplace   /* OUT: Set to true if constraint may cause a replace */
){
  int i;              /* loop counter */
  Vdbe *v;            /* VDBE under constrution */
  int nCol;           /* Number of columns */
  int onError;        /* Conflict resolution strategy */
  int j1;             /* Addresss of jump instruction */
  int j2 = 0, j3;     /* Addresses of jump instructions */
  int regData;        /* Register containing first data column */
  int iCur;           /* Table cursor number */
  Index *pIdx;         /* Pointer to one of the indices */
  sqlite3 *db;         /* Database connection */
  int seenReplace = 0; /* True if REPLACE is used to resolve INT PK conflict */
  int regOldRowid = (rowidChng && isUpdate) ? rowidChng : regRowid;

  db = pParse->db;
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  assert( pTab->pSelect==0 );  /* This table is not a VIEW */
  nCol = pTab->nCol;
  regData = regRowid + 1;

  /* Test all NOT NULL constraints.
  */
  for(i=0; i<nCol; i++){
    if( i==pTab->iPKey ){
      continue;
    }
    onError = pTab->aCol[i].notNull;
    if( onError==OE_None ) continue;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( onError==OE_Replace && pTab->aCol[i].pDflt==0 ){
      onError = OE_Abort;
    }
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Abort:
        sqlite3MayAbort(pParse);
      case OE_Rollback:
      case OE_Fail: {
        char *zMsg;
        sqlite3VdbeAddOp3(v, OP_HaltIfNull,
                          SQLITE_CONSTRAINT_NOTNULL, onError, regData+i);
        zMsg = sqlite3MPrintf(db, "%s.%s may not be NULL",
                              pTab->zName, pTab->aCol[i].zName);
        sqlite3VdbeChangeP4(v, -1, zMsg, P4_DYNAMIC);
        break;
      }
      case OE_Ignore: {
        sqlite3VdbeAddOp2(v, OP_IsNull, regData+i, ignoreDest);
        break;
      }
      default: {
        assert( onError==OE_Replace );
        j1 = sqlite3VdbeAddOp1(v, OP_NotNull, regData+i);
        sqlite3ExprCode(pParse, pTab->aCol[i].pDflt, regData+i);
        sqlite3VdbeJumpHere(v, j1);
        break;
      }
    }
  }

  /* Test all CHECK constraints
  */
#ifndef SQLITE_OMIT_CHECK
  if( pTab->pCheck && (db->flags & SQLITE_IgnoreChecks)==0 ){
    ExprList *pCheck = pTab->pCheck;
    pParse->ckBase = regData;
    onError = overrideError!=OE_Default ? overrideError : OE_Abort;
    for(i=0; i<pCheck->nExpr; i++){
      int allOk = sqlite3VdbeMakeLabel(v);
      sqlite3ExprIfTrue(pParse, pCheck->a[i].pExpr, allOk, SQLITE_JUMPIFNULL);
      if( onError==OE_Ignore ){
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
      }else{
        char *zConsName = pCheck->a[i].zName;
        if( onError==OE_Replace ) onError = OE_Abort; /* IMP: R-15569-63625 */
        if( zConsName ){
          zConsName = sqlite3MPrintf(db, "constraint %s failed", zConsName);
        }else{
          zConsName = 0;
        }
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_CHECK,
                              onError, zConsName, P4_DYNAMIC);
      }
      sqlite3VdbeResolveLabel(v, allOk);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* If we have an INTEGER PRIMARY KEY, make sure the primary key
  ** of the new record does not previously exist.  Except, if this
  ** is an UPDATE and the primary key is not changing, that is OK.
  */
  if( rowidChng ){
    onError = pTab->keyConf;
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    
    if( isUpdate ){
      j2 = sqlite3VdbeAddOp3(v, OP_Eq, regRowid, 0, rowidChng);
    }
    j3 = sqlite3VdbeAddOp3(v, OP_NotExists, baseCur, 0, regRowid);
    switch( onError ){
      default: {
        onError = OE_Abort;
        /* Fall thru into the next case */
      }
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_PRIMARYKEY,
           onError, "PRIMARY KEY must be unique", P4_STATIC);
        break;
      }
      case OE_Replace: {
        /* If there are DELETE triggers on this table and the
        ** recursive-triggers flag is set, call GenerateRowDelete() to
        ** remove the conflicting row from the table. This will fire
        ** the triggers and remove both the table and index b-tree entries.
        **
        ** Otherwise, if there are no triggers or the recursive-triggers
        ** flag is not set, but the table has one or more indexes, call 
        ** GenerateRowIndexDelete(). This removes the index b-tree entries 
        ** only. The table b-tree entry will be replaced by the new entry 
        ** when it is inserted.  
        **
        ** If either GenerateRowDelete() or GenerateRowIndexDelete() is called,
        ** also invoke MultiWrite() to indicate that this VDBE may require
        ** statement rollback (if the statement is aborted after the delete
        ** takes place). Earlier versions called sqlite3MultiWrite() regardless,
        ** but being more selective here allows statements like:
        **
        **   REPLACE INTO t(rowid) VALUES($newrowid)
        **
        ** to run without a statement journal if there are no indexes on the
        ** table.
        */
        Trigger *pTrigger = 0;
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        if( pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0) ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowDelete(
              pParse, pTab, baseCur, regRowid, 0, pTrigger, OE_Replace
          );
        }else if( pTab->pIndex ){
          sqlite3MultiWrite(pParse);
          sqlite3GenerateRowIndexDelete(pParse, pTab, baseCur, 0);
        }
        seenReplace = 1;
        break;
      }
      case OE_Ignore: {
        assert( seenReplace==0 );
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
    }
    sqlite3VdbeJumpHere(v, j3);
    if( isUpdate ){
      sqlite3VdbeJumpHere(v, j2);
    }
  }

  /* Test all UNIQUE constraints by creating entries for each UNIQUE
  ** index and making sure that duplicate entries do not already exist.
  ** Add the new records to the indices as we go.
  */
  for(iCur=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, iCur++){
    int regIdx;
    int regR;

    if( aRegIdx[iCur]==0 ) continue;  /* Skip unused indices */

    /* Create a key for accessing the index entry */
    regIdx = sqlite3GetTempRange(pParse, pIdx->nColumn+1);
    for(i=0; i<pIdx->nColumn; i++){
      int idx = pIdx->aiColumn[i];
      if( idx==pTab->iPKey ){
        sqlite3VdbeAddOp2(v, OP_SCopy, regRowid, regIdx+i);
      }else{
        sqlite3VdbeAddOp2(v, OP_SCopy, regData+idx, regIdx+i);
      }
    }
    sqlite3VdbeAddOp2(v, OP_SCopy, regRowid, regIdx+i);
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regIdx, pIdx->nColumn+1, aRegIdx[iCur]);
    sqlite3VdbeChangeP4(v, -1, sqlite3IndexAffinityStr(v, pIdx), P4_TRANSIENT);
    sqlite3ExprCacheAffinityChange(pParse, regIdx, pIdx->nColumn+1);

    /* Find out what action to take in case there is an indexing conflict */
    onError = pIdx->onError;
    if( onError==OE_None ){ 
      sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn+1);
      continue;  /* pIdx is not a UNIQUE index */
    }
    if( overrideError!=OE_Default ){
      onError = overrideError;
    }else if( onError==OE_Default ){
      onError = OE_Abort;
    }
    if( seenReplace ){
      if( onError==OE_Ignore ) onError = OE_Replace;
      else if( onError==OE_Fail ) onError = OE_Abort;
    }
    
    /* Check to see if the new index entry will be unique */
    regR = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp2(v, OP_SCopy, regOldRowid, regR);
    j3 = sqlite3VdbeAddOp4(v, OP_IsUnique, baseCur+iCur+1, 0,
                           regR, SQLITE_INT_TO_PTR(regIdx),
                           P4_INT32);
    sqlite3ReleaseTempRange(pParse, regIdx, pIdx->nColumn+1);

    /* Generate code that executes if the new index entry is not unique */
    assert( onError==OE_Rollback || onError==OE_Abort || onError==OE_Fail
        || onError==OE_Ignore || onError==OE_Replace );
    switch( onError ){
      case OE_Rollback:
      case OE_Abort:
      case OE_Fail: {
        int j;
        StrAccum errMsg;
        const char *zSep;
        char *zErr;

        sqlite3StrAccumInit(&errMsg, 0, 0, 200);
        errMsg.db = db;
        zSep = pIdx->nColumn>1 ? "columns " : "column ";
        for(j=0; j<pIdx->nColumn; j++){
          char *zCol = pTab->aCol[pIdx->aiColumn[j]].zName;
          sqlite3StrAccumAppend(&errMsg, zSep, -1);
          zSep = ", ";
          sqlite3StrAccumAppend(&errMsg, zCol, -1);
        }
        sqlite3StrAccumAppend(&errMsg,
            pIdx->nColumn>1 ? " are not unique" : " is not unique", -1);
        zErr = sqlite3StrAccumFinish(&errMsg);
        sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_UNIQUE,
                              onError, zErr, 0);
        sqlite3DbFree(errMsg.db, zErr);
        break;
      }
      case OE_Ignore: {
        assert( seenReplace==0 );
        sqlite3VdbeAddOp2(v, OP_Goto, 0, ignoreDest);
        break;
      }
      default: {
        Trigger *pTrigger = 0;
        assert( onError==OE_Replace );
        sqlite3MultiWrite(pParse);
        if( db->flags&SQLITE_RecTriggers ){
          pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
        }
        sqlite3GenerateRowDelete(
            pParse, pTab, baseCur, regR, 0, pTrigger, OE_Replace
        );
        seenReplace = 1;
        break;
      }
    }
    sqlite3VdbeJumpHere(v, j3);
    sqlite3ReleaseTempReg(pParse, regR);
  }
  
  if( pbMayReplace ){
    *pbMayReplace = seenReplace;
  }
}